

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_fill_rect_multi_color
               (nk_command_buffer *b,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  void *pvVar1;
  nk_command_type in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  nk_size in_RDI;
  undefined4 in_R8D;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  nk_rect *clip;
  nk_command_rect_multi_color *cmd;
  float local_40;
  float local_3c;
  
  if (((((in_RDI != 0) && ((in_XMM1_Da != 0.0 || (NAN(in_XMM1_Da))))) &&
       ((in_XMM1_Db != 0.0 || (NAN(in_XMM1_Db))))) &&
      ((*(int *)(in_RDI + 0x18) == 0 ||
       ((((*(float *)(in_RDI + 8) <= in_XMM0_Da + in_XMM1_Da &&
          (in_XMM0_Da <= *(float *)(in_RDI + 8) + *(float *)(in_RDI + 0x10))) &&
         (*(float *)(in_RDI + 0xc) <= in_XMM0_Db + in_XMM1_Db)) &&
        (in_XMM0_Db <= *(float *)(in_RDI + 0xc) + *(float *)(in_RDI + 0x14))))))) &&
     (pvVar1 = nk_command_buffer_push((nk_command_buffer *)CONCAT44(in_ESI,in_EDX),in_ECX,in_RDI),
     pvVar1 != (void *)0x0)) {
    *(short *)((long)pvVar1 + 0x10) = (short)(int)in_XMM0_Da;
    *(short *)((long)pvVar1 + 0x12) = (short)(int)in_XMM0_Db;
    local_3c = in_XMM1_Da;
    if (in_XMM1_Da <= 0.0) {
      local_3c = 0.0;
    }
    *(short *)((long)pvVar1 + 0x14) = (short)(int)local_3c;
    local_40 = in_XMM1_Db;
    if (in_XMM1_Db <= 0.0) {
      local_40 = 0.0;
    }
    *(short *)((long)pvVar1 + 0x16) = (short)(int)local_40;
    *(undefined4 *)((long)pvVar1 + 0x18) = in_ESI;
    *(undefined4 *)((long)pvVar1 + 0x1c) = in_EDX;
    *(nk_command_type *)((long)pvVar1 + 0x24) = in_ECX;
    *(undefined4 *)((long)pvVar1 + 0x20) = in_R8D;
  }
  return;
}

Assistant:

NK_API void
nk_fill_rect_multi_color(struct nk_command_buffer *b, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    struct nk_command_rect_multi_color *cmd;
    NK_ASSERT(b);
    if (!b || rect.w == 0 || rect.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }

    cmd = (struct nk_command_rect_multi_color*)
        nk_command_buffer_push(b, NK_COMMAND_RECT_MULTI_COLOR, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->left = left;
    cmd->top = top;
    cmd->right = right;
    cmd->bottom = bottom;
}